

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Wizard.cxx
# Opt level: O3

void __thiscall Fl_Wizard::draw(Fl_Wizard *this)

{
  int X;
  int Y;
  int W;
  int H;
  Fl_Widget *widget;
  Fl_Boxtype t;
  
  widget = value(this);
  if ((char)(this->super_Fl_Group).super_Fl_Widget.damage_ < '\0') {
    X = (this->super_Fl_Group).super_Fl_Widget.x_;
    Y = (this->super_Fl_Group).super_Fl_Widget.y_;
    W = (this->super_Fl_Group).super_Fl_Widget.w_;
    H = (this->super_Fl_Group).super_Fl_Widget.h_;
    t = (Fl_Boxtype)(this->super_Fl_Group).super_Fl_Widget.box_;
    if (widget != (Fl_Widget *)0x0) {
      Fl_Widget::draw_box((Fl_Widget *)this,t,X,Y,W,H,widget->color_);
      Fl_Group::draw_child(&this->super_Fl_Group,widget);
      return;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,t,X,Y,W,H,(this->super_Fl_Group).super_Fl_Widget.color_);
  }
  else if (widget != (Fl_Widget *)0x0) {
    Fl_Group::update_child(&this->super_Fl_Group,widget);
    return;
  }
  return;
}

Assistant:

void Fl_Wizard::draw() {
  Fl_Widget	*kid;	// Visible child


  kid = value();

  if (damage() & FL_DAMAGE_ALL)
  {
    // Redraw everything...
    if (kid)
    {
      draw_box(box(), x(), y(), w(), h(), kid->color());
      draw_child(*kid);
    }
    else
      draw_box(box(), x(), y(), w(), h(), color());

  }
  else if (kid)
    update_child(*kid);
}